

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseValueTypeList(WastParser *this,TypeVector *out_type_list)

{
  TypeVector *this_00;
  bool bVar1;
  Token local_68;
  value_type local_24;
  TypeVector *local_20;
  TypeVector *out_type_list_local;
  WastParser *this_local;
  
  local_20 = out_type_list;
  out_type_list_local = (TypeVector *)this;
  while( true ) {
    bVar1 = PeekMatch(this,First_Type);
    this_00 = local_20;
    if (!bVar1) break;
    Consume(&local_68,this);
    local_24.enum_ = (Enum)Token::type(&local_68);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(this_00,&local_24);
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseValueTypeList(TypeVector* out_type_list) {
  WABT_TRACE(ParseValueTypeList);
  while (PeekMatch(TokenType::ValueType))
    out_type_list->push_back(Consume().type());

  return Result::Ok;
}